

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * getTypedProperty<std::__cxx11::string>
                   (string *__return_storage_ptr__,cmGeneratorTarget *tgt,string *prop,
                   cmGeneratorExpressionInterpreter *genexInterpreter)

{
  cmValue this;
  string *psVar1;
  bool local_6d;
  allocator<char> local_5a;
  byte local_59;
  string local_58;
  string *local_38;
  cmValue local_30;
  cmValue value;
  cmGeneratorExpressionInterpreter *genexInterpreter_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  value.Value = (string *)genexInterpreter;
  local_38 = (string *)cmGeneratorTarget::GetProperty(tgt,prop);
  this.Value = value.Value;
  local_30 = (cmValue)local_38;
  if (value.Value == (string *)0x0) {
    valueAsString<cmValue>(__return_storage_ptr__,(cmValue)local_38);
  }
  else {
    local_6d = cmValue::operator_cast_to_bool(&local_30);
    local_59 = 0;
    if (local_6d) {
      psVar1 = cmValue::operator*[abi_cxx11_(&local_30);
      std::__cxx11::string::string((string *)&local_58,(string *)psVar1);
      local_59 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_5a);
    }
    local_6d = !local_6d;
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(this.Value,&local_58,prop);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
    if (local_6d) {
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_5a);
    }
    if ((local_59 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypedProperty<std::string>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return valueAsString(value);
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop);
}